

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int commit_record_message(ptls_message_emitter_t *_self)

{
  ulong uVar1;
  st_ptls_traffic_protection_t *in_RDI;
  size_t unaff_retaddr;
  size_t sz;
  int ret;
  st_ptls_record_message_emitter_t *self;
  int local_14;
  
  if (*(long *)(*(long *)(in_RDI->secret + 8) + 0x48) == 0) {
    uVar1 = (*(long *)(*(long *)in_RDI->secret + 0x10) - *(long *)(in_RDI->secret + 0x28)) - 5;
    if (0x4000 < uVar1) {
      __assert_fail("sz <= PTLS_MAX_PLAINTEXT_RECORD_SIZE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                    ,0x2f4,"int commit_record_message(ptls_message_emitter_t *)");
    }
    *(char *)(**(long **)in_RDI->secret + 3 + *(long *)(in_RDI->secret + 0x28)) = (char)(uVar1 >> 8)
    ;
    *(char *)(**(long **)in_RDI->secret + 4 + *(long *)(in_RDI->secret + 0x28)) = (char)uVar1;
    local_14 = 0;
  }
  else {
    local_14 = buffer_encrypt_record((ptls_buffer_t *)sz,unaff_retaddr,in_RDI);
  }
  return local_14;
}

Assistant:

static int commit_record_message(ptls_message_emitter_t *_self)
{
    struct st_ptls_record_message_emitter_t *self = (void *)_self;
    int ret;

    if (self->super.enc->aead != NULL) {
        ret = buffer_encrypt_record(self->super.buf, self->rec_start, self->super.enc);
    } else {
        /* TODO allow CH,SH,HRR above 16KB */
        size_t sz = self->super.buf->off - self->rec_start - 5;
        assert(sz <= PTLS_MAX_PLAINTEXT_RECORD_SIZE);
        self->super.buf->base[self->rec_start + 3] = (uint8_t)(sz >> 8);
        self->super.buf->base[self->rec_start + 4] = (uint8_t)(sz);
        ret = 0;
    }

    return ret;
}